

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_sha256_transform(uint32_t *s,uchar *buf)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uchar *in_RSI;
  uint *in_RDI;
  uint32_t t2_63;
  uint32_t t1_63;
  uint32_t t2_62;
  uint32_t t1_62;
  uint32_t t2_61;
  uint32_t t1_61;
  uint32_t t2_60;
  uint32_t t1_60;
  uint32_t t2_59;
  uint32_t t1_59;
  uint32_t t2_58;
  uint32_t t1_58;
  uint32_t t2_57;
  uint32_t t1_57;
  uint32_t t2_56;
  uint32_t t1_56;
  uint32_t t2_55;
  uint32_t t1_55;
  uint32_t t2_54;
  uint32_t t1_54;
  uint32_t t2_53;
  uint32_t t1_53;
  uint32_t t2_52;
  uint32_t t1_52;
  uint32_t t2_51;
  uint32_t t1_51;
  uint32_t t2_50;
  uint32_t t1_50;
  uint32_t t2_49;
  uint32_t t1_49;
  uint32_t t2_48;
  uint32_t t1_48;
  uint32_t t2_47;
  uint32_t t1_47;
  uint32_t t2_46;
  uint32_t t1_46;
  uint32_t t2_45;
  uint32_t t1_45;
  uint32_t t2_44;
  uint32_t t1_44;
  uint32_t t2_43;
  uint32_t t1_43;
  uint32_t t2_42;
  uint32_t t1_42;
  uint32_t t2_41;
  uint32_t t1_41;
  uint32_t t2_40;
  uint32_t t1_40;
  uint32_t t2_39;
  uint32_t t1_39;
  uint32_t t2_38;
  uint32_t t1_38;
  uint32_t t2_37;
  uint32_t t1_37;
  uint32_t t2_36;
  uint32_t t1_36;
  uint32_t t2_35;
  uint32_t t1_35;
  uint32_t t2_34;
  uint32_t t1_34;
  uint32_t t2_33;
  uint32_t t1_33;
  uint32_t t2_32;
  uint32_t t1_32;
  uint32_t t2_31;
  uint32_t t1_31;
  uint32_t t2_30;
  uint32_t t1_30;
  uint32_t t2_29;
  uint32_t t1_29;
  uint32_t t2_28;
  uint32_t t1_28;
  uint32_t t2_27;
  uint32_t t1_27;
  uint32_t t2_26;
  uint32_t t1_26;
  uint32_t t2_25;
  uint32_t t1_25;
  uint32_t t2_24;
  uint32_t t1_24;
  uint32_t t2_23;
  uint32_t t1_23;
  uint32_t t2_22;
  uint32_t t1_22;
  uint32_t t2_21;
  uint32_t t1_21;
  uint32_t t2_20;
  uint32_t t1_20;
  uint32_t t2_19;
  uint32_t t1_19;
  uint32_t t2_18;
  uint32_t t1_18;
  uint32_t t2_17;
  uint32_t t1_17;
  uint32_t t2_16;
  uint32_t t1_16;
  uint32_t t2_15;
  uint32_t t1_15;
  uint32_t t2_14;
  uint32_t t1_14;
  uint32_t t2_13;
  uint32_t t1_13;
  uint32_t t2_12;
  uint32_t t1_12;
  uint32_t t2_11;
  uint32_t t1_11;
  uint32_t t2_10;
  uint32_t t1_10;
  uint32_t t2_9;
  uint32_t t1_9;
  uint32_t t2_8;
  uint32_t t1_8;
  uint32_t t2_7;
  uint32_t t1_7;
  uint32_t t2_6;
  uint32_t t1_6;
  uint32_t t2_5;
  uint32_t t1_5;
  uint32_t t2_4;
  uint32_t t1_4;
  uint32_t t2_3;
  uint32_t t1_3;
  uint32_t t2_2;
  uint32_t t1_2;
  uint32_t t2_1;
  uint32_t t1_1;
  uint32_t t2;
  uint32_t t1;
  uint32_t w15;
  uint32_t w14;
  uint32_t w13;
  uint32_t w12;
  uint32_t w11;
  uint32_t w10;
  uint32_t w9;
  uint32_t w8;
  uint32_t w7;
  uint32_t w6;
  uint32_t w5;
  uint32_t w4;
  uint32_t w3;
  uint32_t w2;
  uint32_t w1;
  uint32_t w0;
  uint32_t h;
  uint32_t g;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  
  uVar12 = *in_RDI;
  uVar9 = in_RDI[1];
  uVar6 = in_RDI[2];
  uVar3 = in_RDI[3];
  uVar13 = in_RDI[4];
  uVar10 = in_RDI[5];
  uVar7 = in_RDI[6];
  uVar4 = in_RDI[7];
  uVar1 = secp256k1_read_be32(in_RSI);
  iVar2 = uVar4 + ((uVar13 >> 6 | uVar13 << 0x1a) ^ (uVar13 >> 0xb | uVar13 << 0x15) ^
                  (uVar13 >> 0x19 | uVar13 << 7)) + (uVar7 ^ uVar13 & (uVar10 ^ uVar7)) + 0x428a2f98
          + uVar1;
  uVar3 = iVar2 + uVar3;
  uVar4 = iVar2 + ((uVar12 >> 2 | uVar12 << 0x1e) ^ (uVar12 >> 0xd | uVar12 << 0x13) ^
                  (uVar12 >> 0x16 | uVar12 << 10)) + (uVar12 & uVar9 | uVar6 & (uVar12 | uVar9));
  uVar5 = secp256k1_read_be32(in_RSI + 4);
  iVar2 = uVar7 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar10 ^ uVar3 & (uVar13 ^ uVar10)) +
          0x71374491 + uVar5;
  uVar6 = iVar2 + uVar6;
  uVar7 = iVar2 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar12 | uVar9 & (uVar4 | uVar12));
  uVar8 = secp256k1_read_be32(in_RSI + 8);
  iVar2 = uVar10 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                   (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar13 ^ uVar6 & (uVar3 ^ uVar13)) +
          -0x4a3f0431 + uVar8;
  uVar9 = iVar2 + uVar9;
  uVar10 = iVar2 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                   (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar4 | uVar12 & (uVar7 | uVar4));
  uVar11 = secp256k1_read_be32(in_RSI + 0xc);
  iVar2 = uVar13 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                   (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar3 ^ uVar9 & (uVar6 ^ uVar3)) + -0x164a245b
          + uVar11;
  uVar12 = iVar2 + uVar12;
  uVar13 = iVar2 + ((uVar10 >> 2 | uVar10 * 0x40000000) ^ (uVar10 >> 0xd | uVar10 * 0x80000) ^
                   (uVar10 >> 0x16 | uVar10 * 0x400)) + (uVar10 & uVar7 | uVar4 & (uVar10 | uVar7));
  uVar14 = secp256k1_read_be32(in_RSI + 0x10);
  iVar2 = uVar3 + ((uVar12 >> 6 | uVar12 * 0x4000000) ^ (uVar12 >> 0xb | uVar12 * 0x200000) ^
                  (uVar12 >> 0x19 | uVar12 * 0x80)) + (uVar6 ^ uVar12 & (uVar9 ^ uVar6)) +
          0x3956c25b + uVar14;
  uVar4 = iVar2 + uVar4;
  uVar3 = iVar2 + ((uVar13 >> 2 | uVar13 * 0x40000000) ^ (uVar13 >> 0xd | uVar13 * 0x80000) ^
                  (uVar13 >> 0x16 | uVar13 * 0x400)) + (uVar13 & uVar10 | uVar7 & (uVar13 | uVar10))
  ;
  uVar15 = secp256k1_read_be32(in_RSI + 0x14);
  iVar2 = uVar6 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar12 ^ uVar9)) + 0x59f111f1
          + uVar15;
  uVar7 = iVar2 + uVar7;
  uVar6 = iVar2 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar13 | uVar10 & (uVar3 | uVar13));
  uVar16 = secp256k1_read_be32(in_RSI + 0x18);
  iVar2 = uVar9 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar12 ^ uVar7 & (uVar4 ^ uVar12)) +
          -0x6dc07d5c + uVar16;
  uVar10 = iVar2 + uVar10;
  uVar9 = iVar2 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar3 | uVar13 & (uVar6 | uVar3));
  uVar17 = secp256k1_read_be32(in_RSI + 0x1c);
  iVar2 = uVar12 + ((uVar10 >> 6 | uVar10 * 0x4000000) ^ (uVar10 >> 0xb | uVar10 * 0x200000) ^
                   (uVar10 >> 0x19 | uVar10 * 0x80)) + (uVar4 ^ uVar10 & (uVar7 ^ uVar4)) +
          -0x54e3a12b + uVar17;
  uVar13 = iVar2 + uVar13;
  uVar12 = iVar2 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                   (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar6 | uVar3 & (uVar9 | uVar6));
  uVar18 = secp256k1_read_be32(in_RSI + 0x20);
  iVar2 = uVar4 + ((uVar13 >> 6 | uVar13 * 0x4000000) ^ (uVar13 >> 0xb | uVar13 * 0x200000) ^
                  (uVar13 >> 0x19 | uVar13 * 0x80)) + (uVar7 ^ uVar13 & (uVar10 ^ uVar7)) +
          -0x27f85568 + uVar18;
  uVar3 = iVar2 + uVar3;
  uVar4 = iVar2 + ((uVar12 >> 2 | uVar12 * 0x40000000) ^ (uVar12 >> 0xd | uVar12 * 0x80000) ^
                  (uVar12 >> 0x16 | uVar12 * 0x400)) + (uVar12 & uVar9 | uVar6 & (uVar12 | uVar9));
  uVar19 = secp256k1_read_be32(in_RSI + 0x24);
  iVar2 = uVar7 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar10 ^ uVar3 & (uVar13 ^ uVar10)) +
          0x12835b01 + uVar19;
  uVar6 = iVar2 + uVar6;
  uVar7 = iVar2 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar12 | uVar9 & (uVar4 | uVar12));
  uVar20 = secp256k1_read_be32(in_RSI + 0x28);
  iVar2 = uVar10 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                   (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar13 ^ uVar6 & (uVar3 ^ uVar13)) +
          0x243185be + uVar20;
  uVar9 = iVar2 + uVar9;
  uVar10 = iVar2 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                   (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar4 | uVar12 & (uVar7 | uVar4));
  uVar21 = secp256k1_read_be32(in_RSI + 0x2c);
  iVar2 = uVar13 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                   (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar3 ^ uVar9 & (uVar6 ^ uVar3)) + 0x550c7dc3
          + uVar21;
  uVar12 = iVar2 + uVar12;
  uVar13 = iVar2 + ((uVar10 >> 2 | uVar10 * 0x40000000) ^ (uVar10 >> 0xd | uVar10 * 0x80000) ^
                   (uVar10 >> 0x16 | uVar10 * 0x400)) + (uVar10 & uVar7 | uVar4 & (uVar10 | uVar7));
  uVar22 = secp256k1_read_be32(in_RSI + 0x30);
  iVar2 = uVar3 + ((uVar12 >> 6 | uVar12 * 0x4000000) ^ (uVar12 >> 0xb | uVar12 * 0x200000) ^
                  (uVar12 >> 0x19 | uVar12 * 0x80)) + (uVar6 ^ uVar12 & (uVar9 ^ uVar6)) +
          0x72be5d74 + uVar22;
  uVar4 = iVar2 + uVar4;
  uVar3 = iVar2 + ((uVar13 >> 2 | uVar13 * 0x40000000) ^ (uVar13 >> 0xd | uVar13 * 0x80000) ^
                  (uVar13 >> 0x16 | uVar13 * 0x400)) + (uVar13 & uVar10 | uVar7 & (uVar13 | uVar10))
  ;
  uVar23 = secp256k1_read_be32(in_RSI + 0x34);
  iVar2 = uVar6 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar12 ^ uVar9)) + -0x7f214e02
          + uVar23;
  uVar7 = iVar2 + uVar7;
  uVar6 = iVar2 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar13 | uVar10 & (uVar3 | uVar13));
  uVar24 = secp256k1_read_be32(in_RSI + 0x38);
  iVar2 = uVar9 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar12 ^ uVar7 & (uVar4 ^ uVar12)) +
          -0x6423f959 + uVar24;
  uVar10 = iVar2 + uVar10;
  uVar9 = iVar2 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar3 | uVar13 & (uVar6 | uVar3));
  uVar25 = secp256k1_read_be32(in_RSI + 0x3c);
  iVar2 = uVar12 + ((uVar10 >> 6 | uVar10 * 0x4000000) ^ (uVar10 >> 0xb | uVar10 * 0x200000) ^
                   (uVar10 >> 0x19 | uVar10 * 0x80)) + (uVar4 ^ uVar10 & (uVar7 ^ uVar4)) +
          -0x3e640e8c + uVar25;
  uVar13 = iVar2 + uVar13;
  uVar12 = iVar2 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                   (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar6 | uVar3 & (uVar9 | uVar6));
  uVar26 = ((uVar24 >> 0x11 | uVar24 << 0xf) ^ (uVar24 >> 0x13 | uVar24 << 0xd) ^ uVar24 >> 10) +
           uVar19 + ((uVar5 >> 7 | uVar5 << 0x19) ^ (uVar5 >> 0x12 | uVar5 << 0xe) ^ uVar5 >> 3) +
           uVar1;
  iVar2 = uVar4 + ((uVar13 >> 6 | uVar13 * 0x4000000) ^ (uVar13 >> 0xb | uVar13 * 0x200000) ^
                  (uVar13 >> 0x19 | uVar13 * 0x80)) + (uVar7 ^ uVar13 & (uVar10 ^ uVar7)) +
          -0x1b64963f + uVar26;
  uVar3 = iVar2 + uVar3;
  uVar4 = iVar2 + ((uVar12 >> 2 | uVar12 * 0x40000000) ^ (uVar12 >> 0xd | uVar12 * 0x80000) ^
                  (uVar12 >> 0x16 | uVar12 * 0x400)) + (uVar12 & uVar9 | uVar6 & (uVar12 | uVar9));
  uVar27 = ((uVar25 >> 0x11 | uVar25 << 0xf) ^ (uVar25 >> 0x13 | uVar25 << 0xd) ^ uVar25 >> 10) +
           uVar20 + ((uVar8 >> 7 | uVar8 << 0x19) ^ (uVar8 >> 0x12 | uVar8 << 0xe) ^ uVar8 >> 3) +
           uVar5;
  iVar2 = uVar7 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar10 ^ uVar3 & (uVar13 ^ uVar10)) +
          -0x1041b87a + uVar27;
  uVar6 = iVar2 + uVar6;
  uVar7 = iVar2 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar12 | uVar9 & (uVar4 | uVar12));
  uVar28 = ((uVar26 >> 0x11 | uVar26 * 0x8000) ^ (uVar26 >> 0x13 | uVar26 * 0x2000) ^ uVar26 >> 10)
           + uVar21 +
           ((uVar11 >> 7 | uVar11 << 0x19) ^ (uVar11 >> 0x12 | uVar11 << 0xe) ^ uVar11 >> 3) + uVar8
  ;
  iVar2 = uVar10 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                   (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar13 ^ uVar6 & (uVar3 ^ uVar13)) + 0xfc19dc6
          + uVar28;
  uVar9 = iVar2 + uVar9;
  uVar10 = iVar2 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                   (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar4 | uVar12 & (uVar7 | uVar4));
  uVar29 = ((uVar27 >> 0x11 | uVar27 * 0x8000) ^ (uVar27 >> 0x13 | uVar27 * 0x2000) ^ uVar27 >> 10)
           + uVar22 +
           ((uVar14 >> 7 | uVar14 << 0x19) ^ (uVar14 >> 0x12 | uVar14 << 0xe) ^ uVar14 >> 3) +
           uVar11;
  iVar2 = uVar13 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                   (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar3 ^ uVar9 & (uVar6 ^ uVar3)) + 0x240ca1cc
          + uVar29;
  uVar12 = iVar2 + uVar12;
  uVar13 = iVar2 + ((uVar10 >> 2 | uVar10 * 0x40000000) ^ (uVar10 >> 0xd | uVar10 * 0x80000) ^
                   (uVar10 >> 0x16 | uVar10 * 0x400)) + (uVar10 & uVar7 | uVar4 & (uVar10 | uVar7));
  uVar30 = ((uVar28 >> 0x11 | uVar28 * 0x8000) ^ (uVar28 >> 0x13 | uVar28 * 0x2000) ^ uVar28 >> 10)
           + uVar23 +
           ((uVar15 >> 7 | uVar15 << 0x19) ^ (uVar15 >> 0x12 | uVar15 << 0xe) ^ uVar15 >> 3) +
           uVar14;
  iVar2 = uVar3 + ((uVar12 >> 6 | uVar12 * 0x4000000) ^ (uVar12 >> 0xb | uVar12 * 0x200000) ^
                  (uVar12 >> 0x19 | uVar12 * 0x80)) + (uVar6 ^ uVar12 & (uVar9 ^ uVar6)) +
          0x2de92c6f + uVar30;
  uVar4 = iVar2 + uVar4;
  uVar3 = iVar2 + ((uVar13 >> 2 | uVar13 * 0x40000000) ^ (uVar13 >> 0xd | uVar13 * 0x80000) ^
                  (uVar13 >> 0x16 | uVar13 * 0x400)) + (uVar13 & uVar10 | uVar7 & (uVar13 | uVar10))
  ;
  uVar31 = ((uVar29 >> 0x11 | uVar29 * 0x8000) ^ (uVar29 >> 0x13 | uVar29 * 0x2000) ^ uVar29 >> 10)
           + uVar24 +
           ((uVar16 >> 7 | uVar16 << 0x19) ^ (uVar16 >> 0x12 | uVar16 << 0xe) ^ uVar16 >> 3) +
           uVar15;
  iVar2 = uVar6 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar12 ^ uVar9)) + 0x4a7484aa
          + uVar31;
  uVar7 = iVar2 + uVar7;
  uVar6 = iVar2 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar13 | uVar10 & (uVar3 | uVar13));
  uVar32 = ((uVar30 >> 0x11 | uVar30 * 0x8000) ^ (uVar30 >> 0x13 | uVar30 * 0x2000) ^ uVar30 >> 10)
           + uVar25 +
           ((uVar17 >> 7 | uVar17 << 0x19) ^ (uVar17 >> 0x12 | uVar17 << 0xe) ^ uVar17 >> 3) +
           uVar16;
  iVar2 = uVar9 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar12 ^ uVar7 & (uVar4 ^ uVar12)) + 0x5cb0a9dc
          + uVar32;
  uVar10 = iVar2 + uVar10;
  uVar9 = iVar2 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar3 | uVar13 & (uVar6 | uVar3));
  uVar33 = ((uVar31 >> 0x11 | uVar31 * 0x8000) ^ (uVar31 >> 0x13 | uVar31 * 0x2000) ^ uVar31 >> 10)
           + uVar26 +
           ((uVar18 >> 7 | uVar18 << 0x19) ^ (uVar18 >> 0x12 | uVar18 << 0xe) ^ uVar18 >> 3) +
           uVar17;
  iVar2 = uVar12 + ((uVar10 >> 6 | uVar10 * 0x4000000) ^ (uVar10 >> 0xb | uVar10 * 0x200000) ^
                   (uVar10 >> 0x19 | uVar10 * 0x80)) + (uVar4 ^ uVar10 & (uVar7 ^ uVar4)) +
          0x76f988da + uVar33;
  uVar13 = iVar2 + uVar13;
  uVar12 = iVar2 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                   (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar6 | uVar3 & (uVar9 | uVar6));
  uVar34 = ((uVar32 >> 0x11 | uVar32 * 0x8000) ^ (uVar32 >> 0x13 | uVar32 * 0x2000) ^ uVar32 >> 10)
           + uVar27 +
           ((uVar19 >> 7 | uVar19 << 0x19) ^ (uVar19 >> 0x12 | uVar19 << 0xe) ^ uVar19 >> 3) +
           uVar18;
  iVar2 = uVar4 + ((uVar13 >> 6 | uVar13 * 0x4000000) ^ (uVar13 >> 0xb | uVar13 * 0x200000) ^
                  (uVar13 >> 0x19 | uVar13 * 0x80)) + (uVar7 ^ uVar13 & (uVar10 ^ uVar7)) +
          -0x67c1aeae + uVar34;
  uVar3 = iVar2 + uVar3;
  uVar4 = iVar2 + ((uVar12 >> 2 | uVar12 * 0x40000000) ^ (uVar12 >> 0xd | uVar12 * 0x80000) ^
                  (uVar12 >> 0x16 | uVar12 * 0x400)) + (uVar12 & uVar9 | uVar6 & (uVar12 | uVar9));
  uVar35 = ((uVar33 >> 0x11 | uVar33 * 0x8000) ^ (uVar33 >> 0x13 | uVar33 * 0x2000) ^ uVar33 >> 10)
           + uVar28 +
           ((uVar20 >> 7 | uVar20 << 0x19) ^ (uVar20 >> 0x12 | uVar20 << 0xe) ^ uVar20 >> 3) +
           uVar19;
  iVar2 = uVar7 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar10 ^ uVar3 & (uVar13 ^ uVar10)) +
          -0x57ce3993 + uVar35;
  uVar6 = iVar2 + uVar6;
  uVar7 = iVar2 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar12 | uVar9 & (uVar4 | uVar12));
  uVar36 = ((uVar34 >> 0x11 | uVar34 * 0x8000) ^ (uVar34 >> 0x13 | uVar34 * 0x2000) ^ uVar34 >> 10)
           + uVar29 +
           ((uVar21 >> 7 | uVar21 << 0x19) ^ (uVar21 >> 0x12 | uVar21 << 0xe) ^ uVar21 >> 3) +
           uVar20;
  iVar2 = uVar10 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                   (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar13 ^ uVar6 & (uVar3 ^ uVar13)) +
          -0x4ffcd838 + uVar36;
  uVar9 = iVar2 + uVar9;
  uVar10 = iVar2 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                   (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar4 | uVar12 & (uVar7 | uVar4));
  uVar37 = ((uVar35 >> 0x11 | uVar35 * 0x8000) ^ (uVar35 >> 0x13 | uVar35 * 0x2000) ^ uVar35 >> 10)
           + uVar30 +
           ((uVar22 >> 7 | uVar22 << 0x19) ^ (uVar22 >> 0x12 | uVar22 << 0xe) ^ uVar22 >> 3) +
           uVar21;
  iVar2 = uVar13 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                   (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar3 ^ uVar9 & (uVar6 ^ uVar3)) + -0x40a68039
          + uVar37;
  uVar12 = iVar2 + uVar12;
  uVar13 = iVar2 + ((uVar10 >> 2 | uVar10 * 0x40000000) ^ (uVar10 >> 0xd | uVar10 * 0x80000) ^
                   (uVar10 >> 0x16 | uVar10 * 0x400)) + (uVar10 & uVar7 | uVar4 & (uVar10 | uVar7));
  uVar38 = ((uVar36 >> 0x11 | uVar36 * 0x8000) ^ (uVar36 >> 0x13 | uVar36 * 0x2000) ^ uVar36 >> 10)
           + uVar31 +
           ((uVar23 >> 7 | uVar23 << 0x19) ^ (uVar23 >> 0x12 | uVar23 << 0xe) ^ uVar23 >> 3) +
           uVar22;
  iVar2 = uVar3 + ((uVar12 >> 6 | uVar12 * 0x4000000) ^ (uVar12 >> 0xb | uVar12 * 0x200000) ^
                  (uVar12 >> 0x19 | uVar12 * 0x80)) + (uVar6 ^ uVar12 & (uVar9 ^ uVar6)) +
          -0x391ff40d + uVar38;
  uVar4 = iVar2 + uVar4;
  uVar3 = iVar2 + ((uVar13 >> 2 | uVar13 * 0x40000000) ^ (uVar13 >> 0xd | uVar13 * 0x80000) ^
                  (uVar13 >> 0x16 | uVar13 * 0x400)) + (uVar13 & uVar10 | uVar7 & (uVar13 | uVar10))
  ;
  uVar39 = ((uVar37 >> 0x11 | uVar37 * 0x8000) ^ (uVar37 >> 0x13 | uVar37 * 0x2000) ^ uVar37 >> 10)
           + uVar32 +
           ((uVar24 >> 7 | uVar24 << 0x19) ^ (uVar24 >> 0x12 | uVar24 << 0xe) ^ uVar24 >> 3) +
           uVar23;
  iVar2 = uVar6 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar12 ^ uVar9)) + -0x2a586eb9
          + uVar39;
  uVar7 = iVar2 + uVar7;
  uVar6 = iVar2 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar13 | uVar10 & (uVar3 | uVar13));
  uVar40 = ((uVar38 >> 0x11 | uVar38 * 0x8000) ^ (uVar38 >> 0x13 | uVar38 * 0x2000) ^ uVar38 >> 10)
           + uVar33 +
           ((uVar25 >> 7 | uVar25 << 0x19) ^ (uVar25 >> 0x12 | uVar25 << 0xe) ^ uVar25 >> 3) +
           uVar24;
  iVar2 = uVar9 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar12 ^ uVar7 & (uVar4 ^ uVar12)) + 0x6ca6351
          + uVar40;
  uVar10 = iVar2 + uVar10;
  uVar9 = iVar2 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar3 | uVar13 & (uVar6 | uVar3));
  uVar41 = ((uVar39 >> 0x11 | uVar39 * 0x8000) ^ (uVar39 >> 0x13 | uVar39 * 0x2000) ^ uVar39 >> 10)
           + uVar34 +
           ((uVar26 >> 7 | uVar26 * 0x2000000) ^ (uVar26 >> 0x12 | uVar26 * 0x4000) ^ uVar26 >> 3) +
           uVar25;
  iVar2 = uVar12 + ((uVar10 >> 6 | uVar10 * 0x4000000) ^ (uVar10 >> 0xb | uVar10 * 0x200000) ^
                   (uVar10 >> 0x19 | uVar10 * 0x80)) + (uVar4 ^ uVar10 & (uVar7 ^ uVar4)) +
          0x14292967 + uVar41;
  uVar13 = iVar2 + uVar13;
  uVar12 = iVar2 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                   (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar6 | uVar3 & (uVar9 | uVar6));
  uVar26 = ((uVar40 >> 0x11 | uVar40 * 0x8000) ^ (uVar40 >> 0x13 | uVar40 * 0x2000) ^ uVar40 >> 10)
           + uVar35 +
           ((uVar27 >> 7 | uVar27 * 0x2000000) ^ (uVar27 >> 0x12 | uVar27 * 0x4000) ^ uVar27 >> 3) +
           uVar26;
  iVar2 = uVar4 + ((uVar13 >> 6 | uVar13 * 0x4000000) ^ (uVar13 >> 0xb | uVar13 * 0x200000) ^
                  (uVar13 >> 0x19 | uVar13 * 0x80)) + (uVar7 ^ uVar13 & (uVar10 ^ uVar7)) +
          0x27b70a85 + uVar26;
  uVar3 = iVar2 + uVar3;
  uVar4 = iVar2 + ((uVar12 >> 2 | uVar12 * 0x40000000) ^ (uVar12 >> 0xd | uVar12 * 0x80000) ^
                  (uVar12 >> 0x16 | uVar12 * 0x400)) + (uVar12 & uVar9 | uVar6 & (uVar12 | uVar9));
  uVar27 = ((uVar41 >> 0x11 | uVar41 * 0x8000) ^ (uVar41 >> 0x13 | uVar41 * 0x2000) ^ uVar41 >> 10)
           + uVar36 +
           ((uVar28 >> 7 | uVar28 * 0x2000000) ^ (uVar28 >> 0x12 | uVar28 * 0x4000) ^ uVar28 >> 3) +
           uVar27;
  iVar2 = uVar7 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar10 ^ uVar3 & (uVar13 ^ uVar10)) +
          0x2e1b2138 + uVar27;
  uVar6 = iVar2 + uVar6;
  uVar7 = iVar2 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar12 | uVar9 & (uVar4 | uVar12));
  uVar28 = ((uVar26 >> 0x11 | uVar26 * 0x8000) ^ (uVar26 >> 0x13 | uVar26 * 0x2000) ^ uVar26 >> 10)
           + uVar37 +
           ((uVar29 >> 7 | uVar29 * 0x2000000) ^ (uVar29 >> 0x12 | uVar29 * 0x4000) ^ uVar29 >> 3) +
           uVar28;
  iVar2 = uVar10 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                   (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar13 ^ uVar6 & (uVar3 ^ uVar13)) +
          0x4d2c6dfc + uVar28;
  uVar9 = iVar2 + uVar9;
  uVar10 = iVar2 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                   (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar4 | uVar12 & (uVar7 | uVar4));
  uVar29 = ((uVar27 >> 0x11 | uVar27 * 0x8000) ^ (uVar27 >> 0x13 | uVar27 * 0x2000) ^ uVar27 >> 10)
           + uVar38 +
           ((uVar30 >> 7 | uVar30 * 0x2000000) ^ (uVar30 >> 0x12 | uVar30 * 0x4000) ^ uVar30 >> 3) +
           uVar29;
  iVar2 = uVar13 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                   (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar3 ^ uVar9 & (uVar6 ^ uVar3)) + 0x53380d13
          + uVar29;
  uVar12 = iVar2 + uVar12;
  uVar13 = iVar2 + ((uVar10 >> 2 | uVar10 * 0x40000000) ^ (uVar10 >> 0xd | uVar10 * 0x80000) ^
                   (uVar10 >> 0x16 | uVar10 * 0x400)) + (uVar10 & uVar7 | uVar4 & (uVar10 | uVar7));
  uVar30 = ((uVar28 >> 0x11 | uVar28 * 0x8000) ^ (uVar28 >> 0x13 | uVar28 * 0x2000) ^ uVar28 >> 10)
           + uVar39 +
           ((uVar31 >> 7 | uVar31 * 0x2000000) ^ (uVar31 >> 0x12 | uVar31 * 0x4000) ^ uVar31 >> 3) +
           uVar30;
  iVar2 = uVar3 + ((uVar12 >> 6 | uVar12 * 0x4000000) ^ (uVar12 >> 0xb | uVar12 * 0x200000) ^
                  (uVar12 >> 0x19 | uVar12 * 0x80)) + (uVar6 ^ uVar12 & (uVar9 ^ uVar6)) +
          0x650a7354 + uVar30;
  uVar4 = iVar2 + uVar4;
  uVar3 = iVar2 + ((uVar13 >> 2 | uVar13 * 0x40000000) ^ (uVar13 >> 0xd | uVar13 * 0x80000) ^
                  (uVar13 >> 0x16 | uVar13 * 0x400)) + (uVar13 & uVar10 | uVar7 & (uVar13 | uVar10))
  ;
  uVar31 = ((uVar29 >> 0x11 | uVar29 * 0x8000) ^ (uVar29 >> 0x13 | uVar29 * 0x2000) ^ uVar29 >> 10)
           + uVar40 +
           ((uVar32 >> 7 | uVar32 * 0x2000000) ^ (uVar32 >> 0x12 | uVar32 * 0x4000) ^ uVar32 >> 3) +
           uVar31;
  iVar2 = uVar6 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar12 ^ uVar9)) + 0x766a0abb
          + uVar31;
  uVar7 = iVar2 + uVar7;
  uVar6 = iVar2 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar13 | uVar10 & (uVar3 | uVar13));
  uVar32 = ((uVar30 >> 0x11 | uVar30 * 0x8000) ^ (uVar30 >> 0x13 | uVar30 * 0x2000) ^ uVar30 >> 10)
           + uVar41 +
           ((uVar33 >> 7 | uVar33 * 0x2000000) ^ (uVar33 >> 0x12 | uVar33 * 0x4000) ^ uVar33 >> 3) +
           uVar32;
  iVar2 = uVar9 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar12 ^ uVar7 & (uVar4 ^ uVar12)) +
          -0x7e3d36d2 + uVar32;
  uVar10 = iVar2 + uVar10;
  uVar9 = iVar2 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar3 | uVar13 & (uVar6 | uVar3));
  uVar33 = ((uVar31 >> 0x11 | uVar31 * 0x8000) ^ (uVar31 >> 0x13 | uVar31 * 0x2000) ^ uVar31 >> 10)
           + uVar26 +
           ((uVar34 >> 7 | uVar34 * 0x2000000) ^ (uVar34 >> 0x12 | uVar34 * 0x4000) ^ uVar34 >> 3) +
           uVar33;
  iVar2 = uVar12 + ((uVar10 >> 6 | uVar10 * 0x4000000) ^ (uVar10 >> 0xb | uVar10 * 0x200000) ^
                   (uVar10 >> 0x19 | uVar10 * 0x80)) + (uVar4 ^ uVar10 & (uVar7 ^ uVar4)) +
          -0x6d8dd37b + uVar33;
  uVar13 = iVar2 + uVar13;
  uVar12 = iVar2 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                   (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar6 | uVar3 & (uVar9 | uVar6));
  uVar34 = ((uVar32 >> 0x11 | uVar32 * 0x8000) ^ (uVar32 >> 0x13 | uVar32 * 0x2000) ^ uVar32 >> 10)
           + uVar27 +
           ((uVar35 >> 7 | uVar35 * 0x2000000) ^ (uVar35 >> 0x12 | uVar35 * 0x4000) ^ uVar35 >> 3) +
           uVar34;
  iVar2 = uVar4 + ((uVar13 >> 6 | uVar13 * 0x4000000) ^ (uVar13 >> 0xb | uVar13 * 0x200000) ^
                  (uVar13 >> 0x19 | uVar13 * 0x80)) + (uVar7 ^ uVar13 & (uVar10 ^ uVar7)) +
          -0x5d40175f + uVar34;
  uVar3 = iVar2 + uVar3;
  uVar4 = iVar2 + ((uVar12 >> 2 | uVar12 * 0x40000000) ^ (uVar12 >> 0xd | uVar12 * 0x80000) ^
                  (uVar12 >> 0x16 | uVar12 * 0x400)) + (uVar12 & uVar9 | uVar6 & (uVar12 | uVar9));
  uVar35 = ((uVar33 >> 0x11 | uVar33 * 0x8000) ^ (uVar33 >> 0x13 | uVar33 * 0x2000) ^ uVar33 >> 10)
           + uVar28 +
           ((uVar36 >> 7 | uVar36 * 0x2000000) ^ (uVar36 >> 0x12 | uVar36 * 0x4000) ^ uVar36 >> 3) +
           uVar35;
  iVar2 = uVar7 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar10 ^ uVar3 & (uVar13 ^ uVar10)) +
          -0x57e599b5 + uVar35;
  uVar6 = iVar2 + uVar6;
  uVar7 = iVar2 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar12 | uVar9 & (uVar4 | uVar12));
  uVar36 = ((uVar34 >> 0x11 | uVar34 * 0x8000) ^ (uVar34 >> 0x13 | uVar34 * 0x2000) ^ uVar34 >> 10)
           + uVar29 +
           ((uVar37 >> 7 | uVar37 * 0x2000000) ^ (uVar37 >> 0x12 | uVar37 * 0x4000) ^ uVar37 >> 3) +
           uVar36;
  iVar2 = uVar10 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                   (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar13 ^ uVar6 & (uVar3 ^ uVar13)) +
          -0x3db47490 + uVar36;
  uVar9 = iVar2 + uVar9;
  uVar10 = iVar2 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                   (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar4 | uVar12 & (uVar7 | uVar4));
  uVar37 = ((uVar35 >> 0x11 | uVar35 * 0x8000) ^ (uVar35 >> 0x13 | uVar35 * 0x2000) ^ uVar35 >> 10)
           + uVar30 +
           ((uVar38 >> 7 | uVar38 * 0x2000000) ^ (uVar38 >> 0x12 | uVar38 * 0x4000) ^ uVar38 >> 3) +
           uVar37;
  iVar2 = uVar13 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                   (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar3 ^ uVar9 & (uVar6 ^ uVar3)) + -0x3893ae5d
          + uVar37;
  uVar12 = iVar2 + uVar12;
  uVar13 = iVar2 + ((uVar10 >> 2 | uVar10 * 0x40000000) ^ (uVar10 >> 0xd | uVar10 * 0x80000) ^
                   (uVar10 >> 0x16 | uVar10 * 0x400)) + (uVar10 & uVar7 | uVar4 & (uVar10 | uVar7));
  uVar38 = ((uVar36 >> 0x11 | uVar36 * 0x8000) ^ (uVar36 >> 0x13 | uVar36 * 0x2000) ^ uVar36 >> 10)
           + uVar31 +
           ((uVar39 >> 7 | uVar39 * 0x2000000) ^ (uVar39 >> 0x12 | uVar39 * 0x4000) ^ uVar39 >> 3) +
           uVar38;
  iVar2 = uVar3 + ((uVar12 >> 6 | uVar12 * 0x4000000) ^ (uVar12 >> 0xb | uVar12 * 0x200000) ^
                  (uVar12 >> 0x19 | uVar12 * 0x80)) + (uVar6 ^ uVar12 & (uVar9 ^ uVar6)) +
          -0x2e6d17e7 + uVar38;
  uVar4 = iVar2 + uVar4;
  uVar3 = iVar2 + ((uVar13 >> 2 | uVar13 * 0x40000000) ^ (uVar13 >> 0xd | uVar13 * 0x80000) ^
                  (uVar13 >> 0x16 | uVar13 * 0x400)) + (uVar13 & uVar10 | uVar7 & (uVar13 | uVar10))
  ;
  uVar39 = ((uVar37 >> 0x11 | uVar37 * 0x8000) ^ (uVar37 >> 0x13 | uVar37 * 0x2000) ^ uVar37 >> 10)
           + uVar32 +
           ((uVar40 >> 7 | uVar40 * 0x2000000) ^ (uVar40 >> 0x12 | uVar40 * 0x4000) ^ uVar40 >> 3) +
           uVar39;
  iVar2 = uVar6 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar12 ^ uVar9)) + -0x2966f9dc
          + uVar39;
  uVar7 = iVar2 + uVar7;
  uVar6 = iVar2 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar13 | uVar10 & (uVar3 | uVar13));
  uVar40 = ((uVar38 >> 0x11 | uVar38 * 0x8000) ^ (uVar38 >> 0x13 | uVar38 * 0x2000) ^ uVar38 >> 10)
           + uVar33 +
           ((uVar41 >> 7 | uVar41 * 0x2000000) ^ (uVar41 >> 0x12 | uVar41 * 0x4000) ^ uVar41 >> 3) +
           uVar40;
  iVar2 = uVar9 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar12 ^ uVar7 & (uVar4 ^ uVar12)) + -0xbf1ca7b
          + uVar40;
  uVar10 = iVar2 + uVar10;
  uVar9 = iVar2 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar3 | uVar13 & (uVar6 | uVar3));
  uVar41 = ((uVar39 >> 0x11 | uVar39 * 0x8000) ^ (uVar39 >> 0x13 | uVar39 * 0x2000) ^ uVar39 >> 10)
           + uVar34 +
           ((uVar26 >> 7 | uVar26 * 0x2000000) ^ (uVar26 >> 0x12 | uVar26 * 0x4000) ^ uVar26 >> 3) +
           uVar41;
  iVar2 = uVar12 + ((uVar10 >> 6 | uVar10 * 0x4000000) ^ (uVar10 >> 0xb | uVar10 * 0x200000) ^
                   (uVar10 >> 0x19 | uVar10 * 0x80)) + (uVar4 ^ uVar10 & (uVar7 ^ uVar4)) +
          0x106aa070 + uVar41;
  uVar13 = iVar2 + uVar13;
  uVar12 = iVar2 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                   (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar6 | uVar3 & (uVar9 | uVar6));
  uVar26 = ((uVar40 >> 0x11 | uVar40 * 0x8000) ^ (uVar40 >> 0x13 | uVar40 * 0x2000) ^ uVar40 >> 10)
           + uVar35 +
           ((uVar27 >> 7 | uVar27 * 0x2000000) ^ (uVar27 >> 0x12 | uVar27 * 0x4000) ^ uVar27 >> 3) +
           uVar26;
  iVar2 = uVar4 + ((uVar13 >> 6 | uVar13 * 0x4000000) ^ (uVar13 >> 0xb | uVar13 * 0x200000) ^
                  (uVar13 >> 0x19 | uVar13 * 0x80)) + (uVar7 ^ uVar13 & (uVar10 ^ uVar7)) +
          0x19a4c116 + uVar26;
  uVar3 = iVar2 + uVar3;
  uVar4 = iVar2 + ((uVar12 >> 2 | uVar12 * 0x40000000) ^ (uVar12 >> 0xd | uVar12 * 0x80000) ^
                  (uVar12 >> 0x16 | uVar12 * 0x400)) + (uVar12 & uVar9 | uVar6 & (uVar12 | uVar9));
  uVar27 = ((uVar41 >> 0x11 | uVar41 * 0x8000) ^ (uVar41 >> 0x13 | uVar41 * 0x2000) ^ uVar41 >> 10)
           + uVar36 +
           ((uVar28 >> 7 | uVar28 * 0x2000000) ^ (uVar28 >> 0x12 | uVar28 * 0x4000) ^ uVar28 >> 3) +
           uVar27;
  iVar2 = uVar7 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar10 ^ uVar3 & (uVar13 ^ uVar10)) +
          0x1e376c08 + uVar27;
  uVar6 = iVar2 + uVar6;
  uVar7 = iVar2 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar12 | uVar9 & (uVar4 | uVar12));
  uVar28 = ((uVar26 >> 0x11 | uVar26 * 0x8000) ^ (uVar26 >> 0x13 | uVar26 * 0x2000) ^ uVar26 >> 10)
           + uVar37 +
           ((uVar29 >> 7 | uVar29 * 0x2000000) ^ (uVar29 >> 0x12 | uVar29 * 0x4000) ^ uVar29 >> 3) +
           uVar28;
  iVar2 = uVar10 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                   (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar13 ^ uVar6 & (uVar3 ^ uVar13)) +
          0x2748774c + uVar28;
  uVar9 = iVar2 + uVar9;
  uVar10 = iVar2 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                   (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar4 | uVar12 & (uVar7 | uVar4));
  uVar29 = ((uVar27 >> 0x11 | uVar27 * 0x8000) ^ (uVar27 >> 0x13 | uVar27 * 0x2000) ^ uVar27 >> 10)
           + uVar38 +
           ((uVar30 >> 7 | uVar30 * 0x2000000) ^ (uVar30 >> 0x12 | uVar30 * 0x4000) ^ uVar30 >> 3) +
           uVar29;
  iVar2 = uVar13 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                   (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar3 ^ uVar9 & (uVar6 ^ uVar3)) + 0x34b0bcb5
          + uVar29;
  uVar12 = iVar2 + uVar12;
  uVar13 = iVar2 + ((uVar10 >> 2 | uVar10 * 0x40000000) ^ (uVar10 >> 0xd | uVar10 * 0x80000) ^
                   (uVar10 >> 0x16 | uVar10 * 0x400)) + (uVar10 & uVar7 | uVar4 & (uVar10 | uVar7));
  uVar30 = ((uVar28 >> 0x11 | uVar28 * 0x8000) ^ (uVar28 >> 0x13 | uVar28 * 0x2000) ^ uVar28 >> 10)
           + uVar39 +
           ((uVar31 >> 7 | uVar31 * 0x2000000) ^ (uVar31 >> 0x12 | uVar31 * 0x4000) ^ uVar31 >> 3) +
           uVar30;
  iVar2 = uVar3 + ((uVar12 >> 6 | uVar12 * 0x4000000) ^ (uVar12 >> 0xb | uVar12 * 0x200000) ^
                  (uVar12 >> 0x19 | uVar12 * 0x80)) + (uVar6 ^ uVar12 & (uVar9 ^ uVar6)) +
          0x391c0cb3 + uVar30;
  uVar4 = iVar2 + uVar4;
  uVar3 = iVar2 + ((uVar13 >> 2 | uVar13 * 0x40000000) ^ (uVar13 >> 0xd | uVar13 * 0x80000) ^
                  (uVar13 >> 0x16 | uVar13 * 0x400)) + (uVar13 & uVar10 | uVar7 & (uVar13 | uVar10))
  ;
  uVar31 = ((uVar29 >> 0x11 | uVar29 * 0x8000) ^ (uVar29 >> 0x13 | uVar29 * 0x2000) ^ uVar29 >> 10)
           + uVar40 +
           ((uVar32 >> 7 | uVar32 * 0x2000000) ^ (uVar32 >> 0x12 | uVar32 * 0x4000) ^ uVar32 >> 3) +
           uVar31;
  iVar2 = uVar6 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar12 ^ uVar9)) + 0x4ed8aa4a
          + uVar31;
  uVar7 = iVar2 + uVar7;
  uVar6 = iVar2 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar13 | uVar10 & (uVar3 | uVar13));
  uVar32 = ((uVar30 >> 0x11 | uVar30 * 0x8000) ^ (uVar30 >> 0x13 | uVar30 * 0x2000) ^ uVar30 >> 10)
           + uVar41 +
           ((uVar33 >> 7 | uVar33 * 0x2000000) ^ (uVar33 >> 0x12 | uVar33 * 0x4000) ^ uVar33 >> 3) +
           uVar32;
  iVar2 = uVar9 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar12 ^ uVar7 & (uVar4 ^ uVar12)) + 0x5b9cca4f
          + uVar32;
  uVar10 = iVar2 + uVar10;
  uVar9 = iVar2 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar3 | uVar13 & (uVar6 | uVar3));
  uVar33 = ((uVar31 >> 0x11 | uVar31 * 0x8000) ^ (uVar31 >> 0x13 | uVar31 * 0x2000) ^ uVar31 >> 10)
           + uVar26 +
           ((uVar34 >> 7 | uVar34 * 0x2000000) ^ (uVar34 >> 0x12 | uVar34 * 0x4000) ^ uVar34 >> 3) +
           uVar33;
  iVar2 = uVar12 + ((uVar10 >> 6 | uVar10 * 0x4000000) ^ (uVar10 >> 0xb | uVar10 * 0x200000) ^
                   (uVar10 >> 0x19 | uVar10 * 0x80)) + (uVar4 ^ uVar10 & (uVar7 ^ uVar4)) +
          0x682e6ff3 + uVar33;
  uVar13 = iVar2 + uVar13;
  uVar12 = iVar2 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                   (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar6 | uVar3 & (uVar9 | uVar6));
  uVar34 = ((uVar32 >> 0x11 | uVar32 * 0x8000) ^ (uVar32 >> 0x13 | uVar32 * 0x2000) ^ uVar32 >> 10)
           + uVar27 +
           ((uVar35 >> 7 | uVar35 * 0x2000000) ^ (uVar35 >> 0x12 | uVar35 * 0x4000) ^ uVar35 >> 3) +
           uVar34;
  iVar2 = uVar4 + ((uVar13 >> 6 | uVar13 * 0x4000000) ^ (uVar13 >> 0xb | uVar13 * 0x200000) ^
                  (uVar13 >> 0x19 | uVar13 * 0x80)) + (uVar7 ^ uVar13 & (uVar10 ^ uVar7)) +
          0x748f82ee + uVar34;
  uVar3 = iVar2 + uVar3;
  uVar4 = iVar2 + ((uVar12 >> 2 | uVar12 * 0x40000000) ^ (uVar12 >> 0xd | uVar12 * 0x80000) ^
                  (uVar12 >> 0x16 | uVar12 * 0x400)) + (uVar12 & uVar9 | uVar6 & (uVar12 | uVar9));
  uVar35 = ((uVar33 >> 0x11 | uVar33 * 0x8000) ^ (uVar33 >> 0x13 | uVar33 * 0x2000) ^ uVar33 >> 10)
           + uVar28 +
           ((uVar36 >> 7 | uVar36 * 0x2000000) ^ (uVar36 >> 0x12 | uVar36 * 0x4000) ^ uVar36 >> 3) +
           uVar35;
  iVar2 = uVar7 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar10 ^ uVar3 & (uVar13 ^ uVar10)) +
          0x78a5636f + uVar35;
  uVar6 = iVar2 + uVar6;
  uVar7 = iVar2 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar12 | uVar9 & (uVar4 | uVar12));
  uVar36 = ((uVar34 >> 0x11 | uVar34 * 0x8000) ^ (uVar34 >> 0x13 | uVar34 * 0x2000) ^ uVar34 >> 10)
           + uVar29 +
           ((uVar37 >> 7 | uVar37 * 0x2000000) ^ (uVar37 >> 0x12 | uVar37 * 0x4000) ^ uVar37 >> 3) +
           uVar36;
  iVar2 = uVar10 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                   (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar13 ^ uVar6 & (uVar3 ^ uVar13)) +
          -0x7b3787ec + uVar36;
  uVar9 = iVar2 + uVar9;
  uVar10 = iVar2 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                   (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar4 | uVar12 & (uVar7 | uVar4));
  uVar37 = ((uVar35 >> 0x11 | uVar35 * 0x8000) ^ (uVar35 >> 0x13 | uVar35 * 0x2000) ^ uVar35 >> 10)
           + uVar30 +
           ((uVar38 >> 7 | uVar38 * 0x2000000) ^ (uVar38 >> 0x12 | uVar38 * 0x4000) ^ uVar38 >> 3) +
           uVar37;
  iVar2 = uVar13 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                   (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar3 ^ uVar9 & (uVar6 ^ uVar3)) + -0x7338fdf8
          + uVar37;
  uVar12 = iVar2 + uVar12;
  uVar13 = iVar2 + ((uVar10 >> 2 | uVar10 * 0x40000000) ^ (uVar10 >> 0xd | uVar10 * 0x80000) ^
                   (uVar10 >> 0x16 | uVar10 * 0x400)) + (uVar10 & uVar7 | uVar4 & (uVar10 | uVar7));
  uVar38 = ((uVar36 >> 0x11 | uVar36 * 0x8000) ^ (uVar36 >> 0x13 | uVar36 * 0x2000) ^ uVar36 >> 10)
           + uVar31 +
           ((uVar39 >> 7 | uVar39 * 0x2000000) ^ (uVar39 >> 0x12 | uVar39 * 0x4000) ^ uVar39 >> 3) +
           uVar38;
  iVar2 = uVar3 + ((uVar12 >> 6 | uVar12 * 0x4000000) ^ (uVar12 >> 0xb | uVar12 * 0x200000) ^
                  (uVar12 >> 0x19 | uVar12 * 0x80)) + (uVar6 ^ uVar12 & (uVar9 ^ uVar6)) +
          -0x6f410006 + uVar38;
  uVar4 = iVar2 + uVar4;
  uVar3 = iVar2 + ((uVar13 >> 2 | uVar13 * 0x40000000) ^ (uVar13 >> 0xd | uVar13 * 0x80000) ^
                  (uVar13 >> 0x16 | uVar13 * 0x400)) + (uVar13 & uVar10 | uVar7 & (uVar13 | uVar10))
  ;
  uVar39 = ((uVar37 >> 0x11 | uVar37 * 0x8000) ^ (uVar37 >> 0x13 | uVar37 * 0x2000) ^ uVar37 >> 10)
           + uVar32 +
           ((uVar40 >> 7 | uVar40 * 0x2000000) ^ (uVar40 >> 0x12 | uVar40 * 0x4000) ^ uVar40 >> 3) +
           uVar39;
  iVar2 = uVar6 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar12 ^ uVar9)) + -0x5baf9315
          + uVar39;
  uVar7 = iVar2 + uVar7;
  uVar6 = iVar2 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar13 | uVar10 & (uVar3 | uVar13));
  iVar2 = uVar9 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar12 ^ uVar7 & (uVar4 ^ uVar12)) +
          -0x41065c09 +
          uVar40 + ((uVar38 >> 0x11 | uVar38 * 0x8000) ^ (uVar38 >> 0x13 | uVar38 * 0x2000) ^
                   uVar38 >> 10) + uVar33 +
          ((uVar41 >> 7 | uVar41 * 0x2000000) ^ (uVar41 >> 0x12 | uVar41 * 0x4000) ^ uVar41 >> 3);
  uVar10 = iVar2 + uVar10;
  uVar9 = iVar2 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar3 | uVar13 & (uVar6 | uVar3));
  iVar2 = uVar12 + ((uVar10 >> 6 | uVar10 * 0x4000000) ^ (uVar10 >> 0xb | uVar10 * 0x200000) ^
                   (uVar10 >> 0x19 | uVar10 * 0x80)) + (uVar4 ^ uVar10 & (uVar7 ^ uVar4)) +
          -0x398e870e +
          uVar41 + ((uVar39 >> 0x11 | uVar39 * 0x8000) ^ (uVar39 >> 0x13 | uVar39 * 0x2000) ^
                   uVar39 >> 10) + uVar34 +
          ((uVar26 >> 7 | uVar26 * 0x2000000) ^ (uVar26 >> 0x12 | uVar26 * 0x4000) ^ uVar26 >> 3);
  *in_RDI = iVar2 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                    (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar6 | uVar3 & (uVar9 | uVar6)) +
            *in_RDI;
  in_RDI[1] = uVar9 + in_RDI[1];
  in_RDI[2] = uVar6 + in_RDI[2];
  in_RDI[3] = uVar3 + in_RDI[3];
  in_RDI[4] = iVar2 + uVar13 + in_RDI[4];
  in_RDI[5] = uVar10 + in_RDI[5];
  in_RDI[6] = uVar7 + in_RDI[6];
  in_RDI[7] = uVar4 + in_RDI[7];
  return;
}

Assistant:

static void secp256k1_sha256_transform(uint32_t* s, const unsigned char* buf) {
    uint32_t a = s[0], b = s[1], c = s[2], d = s[3], e = s[4], f = s[5], g = s[6], h = s[7];
    uint32_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

    Round(a, b, c, d, e, f, g, h, 0x428a2f98,  w0 = secp256k1_read_be32(&buf[0]));
    Round(h, a, b, c, d, e, f, g, 0x71374491,  w1 = secp256k1_read_be32(&buf[4]));
    Round(g, h, a, b, c, d, e, f, 0xb5c0fbcf,  w2 = secp256k1_read_be32(&buf[8]));
    Round(f, g, h, a, b, c, d, e, 0xe9b5dba5,  w3 = secp256k1_read_be32(&buf[12]));
    Round(e, f, g, h, a, b, c, d, 0x3956c25b,  w4 = secp256k1_read_be32(&buf[16]));
    Round(d, e, f, g, h, a, b, c, 0x59f111f1,  w5 = secp256k1_read_be32(&buf[20]));
    Round(c, d, e, f, g, h, a, b, 0x923f82a4,  w6 = secp256k1_read_be32(&buf[24]));
    Round(b, c, d, e, f, g, h, a, 0xab1c5ed5,  w7 = secp256k1_read_be32(&buf[28]));
    Round(a, b, c, d, e, f, g, h, 0xd807aa98,  w8 = secp256k1_read_be32(&buf[32]));
    Round(h, a, b, c, d, e, f, g, 0x12835b01,  w9 = secp256k1_read_be32(&buf[36]));
    Round(g, h, a, b, c, d, e, f, 0x243185be, w10 = secp256k1_read_be32(&buf[40]));
    Round(f, g, h, a, b, c, d, e, 0x550c7dc3, w11 = secp256k1_read_be32(&buf[44]));
    Round(e, f, g, h, a, b, c, d, 0x72be5d74, w12 = secp256k1_read_be32(&buf[48]));
    Round(d, e, f, g, h, a, b, c, 0x80deb1fe, w13 = secp256k1_read_be32(&buf[52]));
    Round(c, d, e, f, g, h, a, b, 0x9bdc06a7, w14 = secp256k1_read_be32(&buf[56]));
    Round(b, c, d, e, f, g, h, a, 0xc19bf174, w15 = secp256k1_read_be32(&buf[60]));

    Round(a, b, c, d, e, f, g, h, 0xe49b69c1, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0xefbe4786, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x0fc19dc6, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x240ca1cc, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x2de92c6f, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x4a7484aa, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x5cb0a9dc, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x76f988da, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0x983e5152, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0xa831c66d, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0xb00327c8, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0xbf597fc7, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0xc6e00bf3, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xd5a79147, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0x06ca6351, w14 += sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0x14292967, w15 += sigma1(w13) + w8 + sigma0(w0));

    Round(a, b, c, d, e, f, g, h, 0x27b70a85, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0x2e1b2138, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x4d2c6dfc, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x53380d13, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x650a7354, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x766a0abb, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x81c2c92e, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x92722c85, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0xa2bfe8a1, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0xa81a664b, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0xc24b8b70, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0xc76c51a3, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0xd192e819, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xd6990624, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0xf40e3585, w14 += sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0x106aa070, w15 += sigma1(w13) + w8 + sigma0(w0));

    Round(a, b, c, d, e, f, g, h, 0x19a4c116, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0x1e376c08, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x2748774c, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x34b0bcb5, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x391c0cb3, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x4ed8aa4a, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x5b9cca4f, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x682e6ff3, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0x748f82ee, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0x78a5636f, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0x84c87814, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0x8cc70208, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0x90befffa, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xa4506ceb, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0xbef9a3f7, w14 + sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0xc67178f2, w15 + sigma1(w13) + w8 + sigma0(w0));

    s[0] += a;
    s[1] += b;
    s[2] += c;
    s[3] += d;
    s[4] += e;
    s[5] += f;
    s[6] += g;
    s[7] += h;
}